

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAttach.c
# Opt level: O2

int Abc_NtkAttach(Abc_Ntk_t *pNtk)

{
  size_t __size;
  Abc_Ntk_t *pNtk_00;
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  Mio_Gate_t **__ptr;
  uint **puTruthGates;
  uint *puVar5;
  Abc_Obj_t *pAVar6;
  Mio_Gate_t *pMVar7;
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  Mio_Library_t *pLib;
  int iVar14;
  char cVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int nGates;
  undefined8 local_f0;
  Mio_Library_t *local_e8;
  uint local_e0 [2];
  undefined8 local_d8;
  uint uStack_d0;
  uint uStack_cc;
  Abc_Ntk_t *local_c0;
  uint uTruths [6] [2];
  int Perm [10];
  int pTempInts [10];
  
  if ((pNtk->ntkFunc != ABC_FUNC_SOP) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcAttach.c"
                  ,0x45,"int Abc_NtkAttach(Abc_Ntk_t *)");
  }
  iVar14 = 0;
  local_e8 = (Mio_Library_t *)Abc_FrameReadLibGen();
  if (local_e8 == (Mio_Library_t *)0x0) {
    puts("The current library is not available.");
  }
  else {
    for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
      uTruths[lVar4][0] = 0;
    }
    for (uVar9 = 0; uVar9 != 0x20; uVar9 = uVar9 + 1) {
      for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
        if ((uVar9 >> ((uint)lVar4 & 0x1f) & 1) != 0) {
          uTruths[lVar4][0] = uTruths[lVar4][0] | 1 << ((byte)uVar9 & 0x1f);
        }
      }
    }
    for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
      uTruths[lVar4][1] = uTruths[lVar4][0];
    }
    uTruths[5][0] = 0;
    uTruths[5][1] = 0xffffffff;
    iVar14 = 1;
    __ptr = Mio_CollectRoots(local_e8,6,1e+20,1,&nGates,0);
    iVar1 = nGates;
    lVar16 = (long)nGates;
    __size = lVar16 * 8;
    puTruthGates = (uint **)malloc(__size);
    puVar5 = (uint *)malloc(__size);
    *puTruthGates = puVar5;
    for (lVar4 = 1; lVar4 < lVar16; lVar4 = lVar4 + 1) {
      puTruthGates[lVar4] = puTruthGates[lVar4 + -1] + 2;
    }
    local_c0 = pNtk;
    for (lVar4 = 0; pNtk_00 = local_c0, lVar4 < iVar1; lVar4 = lVar4 + 1) {
      pMVar7 = __ptr[lVar4];
      iVar1 = Mio_GateReadPinNum(pMVar7);
      Mio_DeriveTruthTable(pMVar7,uTruths,iVar1,6,puTruthGates[lVar4]);
      iVar1 = nGates;
    }
    Abc_NtkCleanCopy(local_c0);
    pLib = local_e8;
    for (iVar1 = 0; iVar1 < pNtk_00->vObjs->nSize; iVar1 = iVar1 + 1) {
      pAVar6 = Abc_NtkObj(pNtk_00,iVar1);
      iVar2 = nGates;
      if ((pAVar6 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar6->field_0x14 & 0xf) == 7)) {
        iVar3 = (pAVar6->vFanins).nSize;
        if (iVar3 == 1) {
          iVar2 = Abc_SopIsBuf((char *)(pAVar6->field_5).pData);
          if (iVar2 == 0) {
            pMVar7 = Mio_LibraryReadInv(pLib);
          }
          else {
            pMVar7 = Mio_LibraryReadBuf(pLib);
          }
        }
        else {
          if (iVar3 != 0) {
            if (6 < iVar3) {
              pcVar8 = Abc_ObjName(pAVar6);
              pcVar11 = "Cannot attach gate with more than 6 inputs to node %s.\n";
LAB_00263ed4:
              printf(pcVar11,pcVar8);
              free(*puTruthGates);
              free(puTruthGates);
              free(__ptr);
              return 0;
            }
            pcVar8 = (char *)(pAVar6->field_5).pData;
            iVar3 = Abc_SopGetVarNum(pcVar8);
            uVar9 = 0;
            uVar20 = 0;
            uStack_d0 = 0;
            uStack_cc = 0;
            pcVar11 = pcVar8;
LAB_00263b95:
            cVar15 = *pcVar11;
            if (cVar15 != '\0') {
              uVar19 = 0xffffffff;
              uVar10 = 0xffffffff;
              uVar17 = 0xffffffff;
              uVar18 = 0xffffffff;
              lVar4 = 0;
              do {
                if (cVar15 == '0') {
                  uVar10 = ~uTruths[lVar4][0] & uVar10;
                  uVar17 = ~uTruths[lVar4][1] & uVar17;
                }
                else if (cVar15 == '1') {
                  uVar10 = uVar10 & uTruths[lVar4][0];
                  uVar17 = uVar17 & uTruths[lVar4][1];
                  uVar18 = 0;
                  uVar19 = 0;
                }
                else if ((cVar15 == '\0') || (cVar15 == ' ')) goto LAB_00263be1;
                cVar15 = pcVar11[lVar4 + 1];
                lVar4 = lVar4 + 1;
              } while( true );
            }
            local_f0 = CONCAT44(uVar20,uVar9);
            local_d8 = (char **)CONCAT44(uVar20,uVar9);
            iVar3 = Abc_SopGetPhase(pcVar8);
            if (iVar3 == 0) {
              local_f0 = (ulong)local_d8 ^ (ulong)DAT_007a8710;
            }
            uVar9 = Abc_AttachCompare(puTruthGates,iVar2,(uint *)&local_f0);
            if ((int)uVar9 < 0) {
              local_d8 = s_pPerms;
              if (s_pPerms == (char **)0x0) {
                s_pPerms = Extra_Permutations(6);
                s_nPerms = Extra_Factorial(6);
                local_d8 = s_pPerms;
              }
              uVar20 = s_nPerms;
              if (s_nPerms < 1) {
                uVar20 = 0;
              }
              uVar12 = 0;
              local_d8 = s_pPerms;
              while (uVar12 != uVar20) {
                pcVar8 = local_d8[uVar12];
                local_e0[0] = 0;
                local_e0[1] = 0;
                for (uVar9 = 0; uVar9 != 0x40; uVar9 = uVar9 + 1) {
                  if ((*(uint *)((long)&local_f0 + (ulong)(uVar9 >> 5) * 4) >> (uVar9 & 0x1f) & 1)
                      != 0) {
                    uVar10 = 0;
                    for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
                      if ((uVar9 >> ((uint)lVar4 & 0x1f) & 1) != 0) {
                        uVar10 = uVar10 | 1 << ((byte)pcVar8[lVar4] & 0x1f);
                      }
                    }
                    local_e0[(int)uVar10 >> 5] =
                         local_e0[(int)uVar10 >> 5] | 1 << ((byte)uVar10 & 0x1f);
                  }
                }
                uVar9 = Abc_AttachCompare(puTruthGates,iVar2,local_e0);
                uVar12 = uVar12 + 1;
                if (-1 < (int)uVar9) {
                  for (lVar4 = 0; pLib = local_e8, lVar4 != 6; lVar4 = lVar4 + 1) {
                    Perm[lVar4] = (int)pcVar8[lVar4];
                  }
                  goto LAB_00263d4e;
                }
              }
LAB_00263ec5:
              pcVar8 = Abc_ObjName(pAVar6);
              pcVar11 = "Could not attach the library gate to node %s.\n";
              goto LAB_00263ed4;
            }
            for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
              Perm[lVar4] = (int)lVar4;
            }
LAB_00263d4e:
            pMVar7 = __ptr[uVar9];
            if (pMVar7 == (Mio_Gate_t *)0x0) goto LAB_00263ec5;
            uVar9 = (pAVar6->vFanins).nSize;
            uVar12 = (ulong)uVar9;
            if ((int)uVar9 < 1) {
              uVar12 = 0;
            }
            for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
              pTempInts[uVar13] =
                   *(int *)((long)pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanins).pArray[uVar13]] +
                           0x10);
            }
            for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
              (pAVar6->vFanins).pArray[Perm[uVar13]] = pTempInts[uVar13];
            }
            goto LAB_00263c56;
          }
          iVar2 = Abc_SopIsConst1((char *)(pAVar6->field_5).pData);
          if (iVar2 == 0) {
            pMVar7 = Mio_LibraryReadConst0(pLib);
          }
          else {
            pMVar7 = Mio_LibraryReadConst1(pLib);
          }
        }
LAB_00263c56:
        (pAVar6->field_6).pCopy = (Abc_Obj_t *)pMVar7;
      }
    }
    free(*puTruthGates);
    free(puTruthGates);
    free(__ptr);
    if (s_pPerms != (char **)0x0) {
      free(s_pPerms);
      s_pPerms = (char **)0x0;
    }
    for (iVar1 = 0; iVar2 = pNtk_00->vObjs->nSize, iVar1 < iVar2; iVar1 = iVar1 + 1) {
      pAVar6 = Abc_NtkObj(pNtk_00,iVar1);
      if (((pAVar6 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar6->field_0x14 & 0xf) == 7)) &&
         ((pAVar6->field_6).pTemp == (void *)0x0)) {
        pcVar8 = "Some elementary gates (constant, buffer, or inverter) are missing in the library."
        ;
        goto LAB_00263f08;
      }
    }
    for (iVar1 = 0; iVar1 < iVar2; iVar1 = iVar1 + 1) {
      pAVar6 = Abc_NtkObj(pNtk_00,iVar1);
      if ((pAVar6 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar6->field_0x14 & 0xf) == 7)) {
        pAVar6->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)pAVar6->field_6;
        (pAVar6->field_6).pTemp = (void *)0x0;
      }
      iVar2 = pNtk_00->vObjs->nSize;
    }
    pNtk_00->ntkFunc = ABC_FUNC_MAP;
    Extra_MmFlexStop((Extra_MmFlex_t *)pNtk_00->pManFunc);
    pNtk_00->pManFunc = pLib;
    puts("Library gates are successfully attached to the nodes.");
    iVar1 = Abc_NtkCheck(pNtk_00);
    if (iVar1 == 0) {
      pcVar8 = "Abc_NtkAttach: The network check has failed.";
LAB_00263f08:
      puts(pcVar8);
      iVar14 = 0;
    }
  }
  return iVar14;
LAB_00263be1:
  uVar9 = uVar9 | uVar10;
  uVar20 = uVar20 | uVar17;
  uStack_d0 = uStack_d0 | uVar18;
  uStack_cc = uStack_cc | uVar19;
  pcVar11 = pcVar11 + (iVar3 + 3);
  goto LAB_00263b95;
}

Assistant:

int Abc_NtkAttach( Abc_Ntk_t * pNtk )
{
    Mio_Library_t * pGenlib;
    unsigned ** puTruthGates;
    unsigned uTruths[6][2];
    Abc_Obj_t * pNode;
    Mio_Gate_t ** ppGates;
    int nGates, nFanins, i;

    assert( Abc_NtkIsSopLogic(pNtk) );

    // check that the library is available
    pGenlib = (Mio_Library_t *)Abc_FrameReadLibGen();
    if ( pGenlib == NULL )
    {
        printf( "The current library is not available.\n" );
        return 0;
    }

    // start the truth tables
    Abc_AttachSetupTruthTables( uTruths );
    
    // collect all the gates
    ppGates = Mio_CollectRoots( pGenlib, 6, (float)1.0e+20, 1, &nGates, 0 );

    // derive the gate truth tables
    puTruthGates    = ABC_ALLOC( unsigned *, nGates );
    puTruthGates[0] = ABC_ALLOC( unsigned, 2 * nGates );
    for ( i = 1; i < nGates; i++ )
        puTruthGates[i] = puTruthGates[i-1] + 2;
    for ( i = 0; i < nGates; i++ )
        Mio_DeriveTruthTable( ppGates[i], uTruths, Mio_GateReadPinNum(ppGates[i]), 6, puTruthGates[i] );

    // assign the gates to pNode->pCopy
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        nFanins = Abc_ObjFaninNum(pNode);
        if ( nFanins == 0 )
        {
            if ( Abc_SopIsConst1((char *)pNode->pData) )
                pNode->pCopy = (Abc_Obj_t *)Mio_LibraryReadConst1(pGenlib);
            else
                pNode->pCopy = (Abc_Obj_t *)Mio_LibraryReadConst0(pGenlib);
        }
        else if ( nFanins == 1 )
        {
            if ( Abc_SopIsBuf((char *)pNode->pData) )
                pNode->pCopy = (Abc_Obj_t *)Mio_LibraryReadBuf(pGenlib);
            else
                pNode->pCopy = (Abc_Obj_t *)Mio_LibraryReadInv(pGenlib);
        }
        else if ( nFanins > 6 )
        {
            printf( "Cannot attach gate with more than 6 inputs to node %s.\n", Abc_ObjName(pNode) );
            ABC_FREE( puTruthGates[0] );
            ABC_FREE( puTruthGates );
            ABC_FREE( ppGates );
            return 0;
        }
        else if ( !Abc_NodeAttach( pNode, ppGates, puTruthGates, nGates, uTruths ) )
        {
            printf( "Could not attach the library gate to node %s.\n", Abc_ObjName(pNode) );
            ABC_FREE( puTruthGates[0] );
            ABC_FREE( puTruthGates );
            ABC_FREE( ppGates );
            return 0;
        }
    }
    ABC_FREE( puTruthGates[0] );
    ABC_FREE( puTruthGates );
    ABC_FREE( ppGates );
    ABC_FREE( s_pPerms );

    // perform the final transformation
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( pNode->pCopy == NULL )
        {
            printf( "Some elementary gates (constant, buffer, or inverter) are missing in the library.\n" );
            return 0;
        }
    }

    // replace SOP representation by the gate representation
    Abc_NtkForEachNode( pNtk, pNode, i )
        pNode->pData = pNode->pCopy, pNode->pCopy = NULL;
    pNtk->ntkFunc = ABC_FUNC_MAP;
    Extra_MmFlexStop( (Extra_MmFlex_t *)pNtk->pManFunc );
    pNtk->pManFunc = pGenlib;

    printf( "Library gates are successfully attached to the nodes.\n" );

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkAttach: The network check has failed.\n" );
        return 0;
    }
    return 1;
}